

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

bool __thiscall vmips::callfunc::used_register(callfunc *this,shared_ptr<vmips::VirtReg> *reg)

{
  VirtReg *this_00;
  pointer psVar1;
  bool bVar2;
  long lVar3;
  pointer psVar4;
  pointer psVar5;
  long lVar6;
  
  this_00 = (this->ret).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this_00 != (VirtReg *)0x0) &&
     (bVar2 = VirtReg::operator==(this_00,(reg->
                                          super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr), bVar2)) {
    return true;
  }
  psVar5 = (this->call_with).
           super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->call_with).
           super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)psVar1 - (long)psVar5;
  if (0 < lVar6 >> 6) {
    lVar3 = (lVar6 >> 6) + 1;
    psVar5 = psVar5 + 2;
    do {
      psVar4 = psVar5;
      bVar2 = VirtReg::operator==(psVar4[-2].
                                  super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(reg->
                                         super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
      if (bVar2) {
        psVar4 = psVar4 + -2;
        goto LAB_0011ba5a;
      }
      bVar2 = VirtReg::operator==(psVar4[-1].
                                  super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(reg->
                                         super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
      if (bVar2) {
        psVar4 = psVar4 + -1;
        goto LAB_0011ba5a;
      }
      bVar2 = VirtReg::operator==((psVar4->
                                  super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr,(reg->
                                         super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
      if (bVar2) goto LAB_0011ba5a;
      bVar2 = VirtReg::operator==(psVar4[1].
                                  super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(reg->
                                         super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
      if (bVar2) {
        psVar4 = psVar4 + 1;
        goto LAB_0011ba5a;
      }
      lVar3 = lVar3 + -1;
      lVar6 = lVar6 + -0x40;
      psVar5 = psVar4 + 4;
    } while (1 < lVar3);
    psVar5 = psVar4 + 2;
  }
  lVar6 = lVar6 >> 4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      psVar4 = psVar1;
      if ((lVar6 != 3) ||
         (bVar2 = VirtReg::operator==((psVar5->
                                      super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr,(reg->
                                               super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr), psVar4 = psVar5, bVar2))
      goto LAB_0011ba5a;
      psVar5 = psVar5 + 1;
    }
    bVar2 = VirtReg::operator==((psVar5->
                                super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr,(reg->
                                       super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr);
    psVar4 = psVar5;
    if (bVar2) goto LAB_0011ba5a;
    psVar5 = psVar5 + 1;
  }
  bVar2 = VirtReg::operator==((psVar5->
                              super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              ,(reg->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
  psVar4 = psVar5;
  if (!bVar2) {
    psVar4 = psVar1;
  }
LAB_0011ba5a:
  return psVar4 != psVar1;
}

Assistant:

bool callfunc::used_register(const std::shared_ptr<VirtReg> &reg) const {
    if (ret && *ret == *reg) return true;
    return std::any_of(call_with.begin(), call_with.end(),
                       [&](const std::shared_ptr<VirtReg> &t) { return *t == *reg; });
}